

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

double l2norm(double *vec,int N)

{
  ulong uVar1;
  double dVar2;
  
  dVar2 = 0.0;
  if (0 < N) {
    uVar1 = 0;
    do {
      dVar2 = dVar2 + vec[uVar1] * vec[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  if (0.0 <= dVar2) {
    return SQRT(dVar2);
  }
  dVar2 = sqrt(dVar2);
  return dVar2;
}

Assistant:

double l2norm(double *vec, int N) {
	double l2, sum;
	int i;
	sum = 0.;
	for (i = 0; i < N; ++i) {
		sum += vec[i] * vec[i];
	}
	l2 = sqrt(sum);
	return l2;
}